

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewFloat(double val)

{
  xmlXPathObjectPtr ret;
  double val_local;
  
  val_local = (double)(*xmlMalloc)(0x48);
  if ((undefined4 *)val_local == (undefined4 *)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating float object\n");
    val_local = 0.0;
  }
  else {
    memset((void *)val_local,0,0x48);
    *(undefined4 *)val_local = 3;
    *(double *)((long)val_local + 0x18) = val;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewFloat(double val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating float object\n");
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_NUMBER;
    ret->floatval = val;
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_NUMBER);
#endif
    return(ret);
}